

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O0

ComplexPair * __thiscall Iir::BandPassTransform::transform(BandPassTransform *this,complex_t c)

{
  bool bVar1;
  complex<double> *in_RSI;
  ComplexPair *in_RDI;
  double dVar2;
  complex_t d;
  complex_t u;
  complex_t v;
  ComplexPair *this_00;
  complex<double> *in_stack_fffffffffffffec0;
  complex<double> *in_stack_fffffffffffffed0;
  double in_stack_fffffffffffffed8;
  complex<double> *in_stack_fffffffffffffee0;
  complex<double> *in_stack_fffffffffffffef8;
  complex<double> *in_stack_ffffffffffffff00;
  undefined1 local_f8 [24];
  double local_e0;
  double local_d0;
  undefined1 local_c8 [24];
  double local_b0;
  double local_a0;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 local_70;
  complex<double> local_48;
  complex<double> local_38 [3];
  
  this_00 = in_RDI;
  infinity();
  bVar1 = std::operator==(in_stack_fffffffffffffec0,in_RSI);
  if (bVar1) {
    std::complex<double>::complex(local_38,-1.0,0.0);
    std::complex<double>::complex(&local_48,1.0,0.0);
    ComplexPair::ComplexPair(this_00,(complex_t *)in_RDI,(complex_t *)0x10a6e2);
  }
  else {
    local_70 = 0x3ff0000000000000;
    std::operator+((double *)in_RDI,(complex<double> *)0x10a70d);
    local_88 = 0x3ff0000000000000;
    std::operator-((double *)this_00,(complex<double> *)in_RDI);
    std::operator/((complex<double> *)in_RDI,(complex<double> *)0x10a76c);
    std::complex<double>::complex((complex<double> *)local_98,0.0,0.0);
    dVar2 = *(double *)(in_RSI[2]._M_value + 8) * (*(double *)in_RSI[2]._M_value - 1.0) + 1.0;
    addmul<double,double>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    local_a0 = dVar2;
    local_98._8_8_ = dVar2;
    std::complex<double>::operator+=
              ((complex<double> *)local_98,
               (*(double *)(in_RSI[2]._M_value + 8) * (*(double *)in_RSI[2]._M_value - 1.0) + -1.0)
               * 8.0);
    std::complex<double>::operator*=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    dVar2 = *(double *)(in_RSI[2]._M_value + 8) * (*(double *)in_RSI[2]._M_value - 1.0) + 1.0;
    std::complex<double>::operator+=((complex<double> *)local_98,dVar2 * 4.0);
    std::sqrt<double>(in_stack_fffffffffffffec0);
    local_b0 = dVar2;
    local_98._8_8_ = dVar2;
    std::operator-(in_stack_fffffffffffffec0);
    local_c8._8_8_ = dVar2;
    addmul<double,double>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    local_d0 = dVar2;
    local_c8._8_8_ = dVar2;
    std::complex<double>::operator+=
              ((complex<double> *)local_c8,*(double *)(in_RSI[3]._M_value + 8));
    addmul<double,double>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    local_e0 = dVar2;
    local_98._8_8_ = dVar2;
    std::complex<double>::operator+=
              ((complex<double> *)local_98,*(double *)(in_RSI[3]._M_value + 8));
    std::complex<double>::complex((complex<double> *)local_f8,0.0,0.0);
    addmul<double,double>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    dVar2 = *(double *)(in_RSI[1]._M_value + 8) + 1.0;
    std::operator+((complex<double> *)in_RDI,(double *)0x10aa71);
    local_f8._8_8_ = dVar2;
    std::operator/((complex<double> *)in_RDI,(complex<double> *)0x10aaa3);
    std::operator/((complex<double> *)in_RDI,(complex<double> *)0x10aac1);
    ComplexPair::ComplexPair(this_00,(complex_t *)in_RDI,(complex_t *)0x10aae0);
  }
  return this_00;
}

Assistant:

ComplexPair BandPassTransform::transform (complex_t c)
{
	if (c == infinity())
		return ComplexPair (-1, 1);
	
	c = (1. + c) / (1. - c); // bilinear
	
	complex_t v = 0;
	v = addmul (v, 4 * (b2 * (a2 - 1) + 1), c);
	v += 8 * (b2 * (a2 - 1) - 1);
	v *= c;
	v += 4 * (b2 * (a2 - 1) + 1);
	v = std::sqrt (v);
	
	complex_t u = -v;
	u = addmul (u, ab_2, c);
	u += ab_2;
	
	v = addmul (v, ab_2, c);
	v += ab_2;
	
	complex_t d = 0;
	d = addmul (d, 2 * (b - 1), c) + 2 * (1 + b);
	
	return ComplexPair (u/d, v/d);
}